

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::flux_divergenceRD
          (PeleLM *this,MultiFab *a_state,int stateComp,MultiFab *a_divergence,int divComp,
          MultiFab **a_fluxes,int fluxComp,int nComp,BCRec *d_bc,Real scale,Real a_dt,
          int areSpeciesFluxes)

{
  Box *pBVar1;
  EBCellFlagFab *this_00;
  string redistribution_type;
  string redistribution_type_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  EBFArrayBoxFactory *this_01;
  bool bVar4;
  int i;
  FabType FVar5;
  int iVar6;
  FabArray<amrex::EBCellFlagFab> *pFVar7;
  MultiCutFab *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  int *piVar8;
  ulong uVar9;
  Geometry *this_04;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  int k;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  double *pdVar23;
  int j;
  string *this_05;
  undefined8 uVar24;
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  Periodicity PVar28;
  undefined8 in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff900;
  Box local_6d4;
  Geometry *local_6b8;
  Real local_6b0;
  EBFArrayBoxFactory *local_6a8;
  long local_6a0;
  Box result;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  Box local_648;
  Array4<double> local_620;
  long local_5e0;
  long local_5d8;
  ulong local_5d0;
  ulong local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined8 local_588;
  undefined4 local_580;
  undefined1 local_57c [16];
  MFIter mfi;
  Array4<const_amrex::EBCellFlag> local_508;
  Array4<double> local_4c8;
  Array4<double> local_488;
  Elixir eli;
  string local_430 [32];
  string local_410 [32];
  Array4<const_double> local_3f0;
  Array4<const_double> local_3b0;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> local_1f0;
  MultiFab divTemp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi._12_12_ = SUB1612((undefined1  [16])0x0,4);
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_6b0 = a_dt;
  amrex::MultiFab::MultiFab
            (&divTemp,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,nComp,
             (a_state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
             (MFInfo *)&mfi,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&divTemp.super_FabArray<amrex::FArrayBox>,0.0);
  flux_divergence(this,&divTemp,0,a_fluxes,fluxComp,nComp,scale);
  this_04 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
  PVar28 = amrex::Geometry::periodicity(this_04);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar28.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar28.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar28.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&divTemp.super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  local_6a8 = (EBFArrayBoxFactory *)
              __dynamic_cast((a_state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo);
  if (local_6a8 == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  local_6b8 = this_04;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_divergence,true);
  local_5d0 = 0;
  if (0 < nComp) {
    local_5d0 = (ulong)(uint)nComp;
  }
  do {
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      amrex::EB_set_covered(a_divergence,0.0);
      amrex::MultiFab::~MultiFab(&divTemp);
      return;
    }
    amrex::MFIter::tilebox(&local_6d4,&mfi);
    pFVar7 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(local_6a8);
    piVar8 = &mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar8 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + mfi.currentIndex;
    }
    this_00 = (pFVar7->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar8];
    local_508.p = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
    local_508.ncomp = (this_00->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar1 = &(this_00->super_BaseFab<amrex::EBCellFlag>).domain;
    local_508.begin.z = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    local_508.begin.x = (pBVar1->smallend).vect[0];
    local_508.begin.y = (pBVar1->smallend).vect[1];
    lVar11 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar17 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar19 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    local_508.jstride = (lVar17 - (pBVar1->smallend).vect[0]) + 1;
    local_508.kstride =
         (lVar11 - (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
         local_508.jstride;
    local_508.nstride = (lVar19 - local_508.begin.z) * local_508.kstride;
    local_508.end._0_8_ = lVar17 + 1U & 0xffffffff | lVar11 << 0x20;
    local_508.end.z = (int)lVar19;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_488,&a_divergence->super_FabArray<amrex::FArrayBox>,&mfi,divComp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_4c8,&divTemp.super_FabArray<amrex::FArrayBox>,&mfi);
    FVar5 = amrex::EBCellFlagFab::getType(this_00,&local_6d4);
    if (FVar5 != covered) {
      result.btype.itype = local_6d4.btype.itype;
      result.smallend.vect[2] = local_6d4.smallend.vect[2] + -4;
      result.bigend.vect[0] = local_6d4.bigend.vect[0] + 4;
      result.smallend.vect[1] = local_6d4.smallend.vect[1] + -4;
      result.smallend.vect[0] = local_6d4.smallend.vect[0] + -4;
      result.bigend.vect[1] = local_6d4.bigend.vect[1] + 4;
      result.bigend.vect[2] = local_6d4.bigend.vect[2] + 4;
      FVar5 = amrex::EBCellFlagFab::getType(this_00,&result);
      this_01 = local_6a8;
      if (FVar5 == regular) {
        lVar19 = (long)local_6d4.smallend.vect[1];
        local_5e0 = (long)local_6d4.smallend.vect[2];
        local_5b0 = local_488.kstride * 8;
        local_6a0 = local_488.nstride * 8;
        local_5d8 = local_4c8.nstride * 8;
        uVar20 = 0;
        lVar11 = (lVar19 - local_4c8.begin.y) * local_4c8.jstride * 8 +
                 (local_5e0 - local_4c8.begin.z) * local_4c8.kstride * 8 +
                 (long)local_6d4.smallend.vect[0] * 8 + (long)local_4c8.begin.x * -8 +
                 (long)local_4c8.p;
        lVar17 = (lVar19 - local_488.begin.y) * local_488.jstride * 8 +
                 (local_5e0 - local_488.begin.z) * local_5b0 + (long)local_6d4.smallend.vect[0] * 8
                 + (long)local_488.begin.x * -8 + (long)local_488.p;
        while (lVar15 = lVar17, lVar13 = lVar11, uVar9 = uVar20, lVar11 = lVar15, lVar17 = lVar13,
              lVar18 = local_5e0, uVar9 != local_5d0) {
          for (; lVar10 = lVar17, lVar16 = lVar19, lVar21 = lVar11,
              lVar18 <= local_6d4.bigend.vect[2]; lVar18 = lVar18 + 1) {
            for (; lVar16 <= local_6d4.bigend.vect[1]; lVar16 = lVar16 + 1) {
              if (local_6d4.smallend.vect[0] <= local_6d4.bigend.vect[0]) {
                lVar12 = 0;
                do {
                  *(undefined8 *)(lVar21 + lVar12 * 8) = *(undefined8 *)(lVar10 + lVar12 * 8);
                  lVar12 = lVar12 + 1;
                } while ((local_6d4.bigend.vect[0] - local_6d4.smallend.vect[0]) + 1 != (int)lVar12)
                ;
              }
              lVar21 = lVar21 + local_488.jstride * 8;
              lVar10 = lVar10 + local_4c8.jstride * 8;
            }
            lVar11 = lVar11 + local_5b0;
            lVar17 = lVar17 + local_4c8.kstride * 8;
          }
          lVar11 = lVar13 + local_5d8;
          lVar17 = lVar15 + local_6a0;
          local_5c8 = uVar9;
          local_5c0 = lVar13;
          local_5b8 = lVar15;
          uVar20 = uVar9 + 1;
        }
      }
      else {
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,local_6a8);
        amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)result.smallend.vect._0_8_,&mfi);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,this_01);
        amrex::MultiCutFab::const_array
                  (&apy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),&mfi)
        ;
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,this_01);
        amrex::MultiCutFab::const_array
                  (&apz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this_01);
        amrex::MultiCutFab::const_array(&fcx,(MultiCutFab *)result.smallend.vect._0_8_,&mfi);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this_01);
        amrex::MultiCutFab::const_array
                  (&fcy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),&mfi)
        ;
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this_01);
        amrex::MultiCutFab::const_array
                  (&fcz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&mfi);
        this_02 = amrex::EBFArrayBoxFactory::getCentroid(this_01);
        amrex::MultiCutFab::const_array(&local_3b0,this_02,&mfi);
        this_03 = &amrex::EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_3f0,this_03,&mfi)
        ;
        local_648.smallend.vect[1] = local_6d4.smallend.vect[1];
        local_648.smallend.vect[0] = local_6d4.smallend.vect[0];
        local_648.btype.itype = local_6d4.btype.itype;
        local_648.bigend.vect[2] = local_6d4.bigend.vect[2];
        local_648.bigend.vect[1] = local_6d4.bigend.vect[1];
        local_648.smallend.vect[2] = local_6d4.smallend.vect[2];
        local_648.bigend.vect[0] = local_6d4.bigend.vect[0];
        bVar4 = std::operator==(&diffusion_redistribution_type_abi_cxx11_,"StateRedist");
        if ((bVar4) ||
           (bVar4 = std::operator==(&diffusion_redistribution_type_abi_cxx11_,"NewStateRedist"),
           bVar4)) {
          iVar6 = local_648.smallend.vect[0] + -3;
          uVar24 = 0x3fffffffd;
LAB_002818fc:
          iVar26 = (int)((ulong)uVar24 >> 0x20);
          local_648.smallend.vect[2] = local_648.smallend.vect[2] + (int)uVar24;
          local_648.bigend.vect[0] = local_648.bigend.vect[0] + iVar26;
          local_648.bigend.vect[1] = local_648.bigend.vect[1] + iVar26;
          local_648.smallend.vect[1] = local_648.smallend.vect[1] + (int)uVar24;
          local_648.smallend.vect[0] = iVar6;
          local_648.bigend.vect[2] = local_648.bigend.vect[2] + iVar26;
        }
        else {
          bVar4 = std::operator==(&diffusion_redistribution_type_abi_cxx11_,"FluxRedist");
          if (bVar4) {
            iVar6 = local_648.smallend.vect[0] + -2;
            uVar24 = 0x2fffffffe;
            goto LAB_002818fc;
          }
        }
        amrex::FArrayBox::FArrayBox((FArrayBox *)&result,&local_648,nComp,true,false,(Arena *)0x0);
        amrex::BaseFab<double>::elixir<double,_0>(&eli,(BaseFab<double> *)&result);
        local_620.p = (double *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
        local_620.begin.x = result.btype.itype;
        local_620.begin.y = local_67c;
        local_620.jstride = ((long)local_674 - (long)(int)result.btype.itype) + 1;
        local_620.kstride = (((long)local_670 + 1) - (long)local_67c) * local_620.jstride;
        local_620.nstride = (((long)local_66c + 1) - (long)local_678) * local_620.kstride;
        local_620.end._0_8_ = (long)local_674 + 1U & 0xffffffff | (long)local_670 + 1 << 0x20;
        local_620.begin.z = local_678;
        local_620.end.z = (int)((long)local_66c + 1);
        bVar4 = std::operator==(&diffusion_redistribution_type_abi_cxx11_,"FluxRedist");
        auVar3 = _DAT_006f8e90;
        auVar2 = _DAT_006f8e80;
        if (bVar4) {
          uVar22 = ~local_620.begin.x + local_620.end.x;
          auVar25._4_4_ = 0;
          auVar25._0_4_ = uVar22;
          auVar25._8_4_ = uVar22;
          auVar25._12_4_ = 0;
          pdVar14 = local_620.p + 1;
          auVar25 = auVar25 ^ _DAT_006f8e90;
          for (lVar11 = (long)local_620.begin.z; pdVar23 = pdVar14, lVar17 = (long)local_620.begin.y
              , lVar11 < local_620.end.z; lVar11 = lVar11 + 1) {
            for (; lVar17 <= (long)local_620.end.y + -1; lVar17 = lVar17 + 1) {
              if (local_620.begin.x < local_620.end.x) {
                uVar20 = 0;
                do {
                  auVar27._8_4_ = (int)uVar20;
                  auVar27._0_8_ = uVar20;
                  auVar27._12_4_ = (int)(uVar20 >> 0x20);
                  auVar27 = (auVar27 | auVar2) ^ auVar3;
                  if ((bool)(~(auVar25._4_4_ < auVar27._4_4_ ||
                              auVar25._0_4_ < auVar27._0_4_ && auVar27._4_4_ == auVar25._4_4_) & 1))
                  {
                    pdVar23[uVar20 - 1] = 1.0;
                  }
                  if (auVar27._12_4_ <= auVar25._12_4_ &&
                      (auVar27._8_4_ <= auVar25._8_4_ || auVar27._12_4_ != auVar25._12_4_)) {
                    pdVar23[uVar20] = 1.0;
                  }
                  uVar20 = uVar20 + 2;
                } while (((ulong)uVar22 + 2 & 0xfffffffffffffffe) != uVar20);
              }
              pdVar23 = pdVar23 + local_620.jstride;
            }
            pdVar14 = pdVar14 + local_620.kstride;
          }
        }
        if (areSpeciesFluxes == 0) {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,&a_state->super_FabArray<amrex::FArrayBox>,&mfi,stateComp);
          this_05 = local_430;
          std::__cxx11::string::string(this_05,(string *)&diffusion_redistribution_type_abi_cxx11_);
          local_598 = (undefined1  [16])0x0;
          local_5a8 = (undefined1  [16])0x0;
          local_588 = 0x100000001;
          local_580 = 1;
          local_57c = (undefined1  [16])0x0;
          redistribution_type_00._M_string_length = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)this_05;
          redistribution_type_00.field_2._M_allocated_capacity = (size_type)local_5a8;
          redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff8f8;
          Redistribution::Apply
                    (&local_6d4,nComp,&local_488,&local_4c8,&local_1f0,&local_620,&local_508,&apx,
                     &apy,&apz,&local_3f0,&fcx,&fcy,&fcz,&local_3b0,d_bc,local_6b8,local_6b0,
                     redistribution_type_00,in_stack_fffffffffffff900,0.5,
                     (Array4<const_double> *)a_state);
        }
        else {
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_1f0,&a_state->super_FabArray<amrex::FArrayBox>,&mfi,stateComp);
          this_05 = local_410;
          std::__cxx11::string::string(this_05,(string *)&diffusion_redistribution_type_abi_cxx11_);
          local_598 = (undefined1  [16])0x0;
          local_5a8 = (undefined1  [16])0x0;
          local_588 = 0x100000001;
          local_580 = 1;
          local_57c = (undefined1  [16])0x0;
          redistribution_type._M_string_length = 2;
          redistribution_type._M_dataplus._M_p = (pointer)this_05;
          redistribution_type.field_2._M_allocated_capacity = (size_type)local_5a8;
          redistribution_type.field_2._8_8_ = in_stack_fffffffffffff8f8;
          Redistribution::Apply
                    (&local_6d4,nComp,&local_488,&local_4c8,&local_1f0,&local_620,&local_508,&apx,
                     &apy,&apz,&local_3f0,&fcx,&fcy,&fcz,&local_3b0,d_bc,local_6b8,local_6b0,
                     redistribution_type,in_stack_fffffffffffff900,0.5,
                     (Array4<const_double> *)a_state);
        }
        std::__cxx11::string::~string(this_05);
        amrex::Gpu::Elixir::~Elixir(&eli);
        amrex::BaseFab<double>::~BaseFab((BaseFab<double> *)&result);
      }
    }
    amrex::MFIter::operator++(&mfi);
  } while( true );
}

Assistant:

void
PeleLM::flux_divergenceRD(const MultiFab        &a_state,
                          int                    stateComp,
                          MultiFab              &a_divergence,
                          int                    divComp,
                          const MultiFab* const* a_fluxes,
                          int                    fluxComp,
                          int                    nComp,
                          BCRec const*           d_bc,
                          Real                   scale,
                          Real                   a_dt,
                          int areSpeciesFluxes)
{
#ifdef AMREX_USE_EB
   // Temporary divTemp to allow fillBoundary
   MultiFab divTemp(grids,dmap,nComp,a_state.nGrow(),MFInfo(),Factory());
   divTemp.setVal(0.0);

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(divTemp, 0, a_fluxes, fluxComp, nComp, scale);

   // FillBoundary
   divTemp.FillBoundary(geom.periodicity());

   // Redistribution
   auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(a_state.Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(a_divergence, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
        auto const& flagfab  = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag     = flagfab.const_array();
        auto const& div_arr  = a_divergence.array(mfi, divComp);
        auto const& divT_arr = divTemp.array(mfi);
        if (flagfab.getType(bx) != FabType::covered ) {
            if (flagfab.getType(grow(bx,4)) != FabType::regular) {
                //
                // Redistribute
                //
                AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

                AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

                auto const &ccc       = ebfact.getCentroid().const_array(mfi);
                auto const &vfrac_arr = ebfact.getVolFrac().const_array(mfi);

                // This is scratch space if calling StateRedistribute,
                //  but is used as the weights (here set to 1) if calling
                //  FluxRedistribute
                Box gbx = bx;

                if (diffusion_redistribution_type == "StateRedist" || 
                    diffusion_redistribution_type == "NewStateRedist")
                  gbx.grow(3);
                else if (diffusion_redistribution_type == "FluxRedist")
                  gbx.grow(2);

                FArrayBox tmpfab(gbx, nComp);
                Elixir eli = tmpfab.elixir();
                Array4<Real> scratch = tmpfab.array(0);
                if (diffusion_redistribution_type == "FluxRedist")
                {
                    amrex::ParallelFor(Box(scratch),
                    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    { scratch(i,j,k) = 1.;});
                }

                if (areSpeciesFluxes) {
                    // Placeholder for eventual species-specific treatment of the redistribution
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                } else {
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                }
            } else {
                // Move from divTmp to outgoing MF
                ParallelFor(bx, nComp, [div_arr, divT_arr]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { div_arr( i, j, k, n ) =  divT_arr(i,j,k,n); });
            }
        }
    }

   EB_set_covered(a_divergence,0.);
#else

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(a_divergence, divComp, a_fluxes, fluxComp, nComp, scale);

#endif
}